

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

LY_ERR lyd_move_nodes(lyd_node *parent,lyd_node **first_dst_p,lyd_node *first_src)

{
  lyd_node *plVar1;
  ly_bool lVar2;
  LY_ERR LVar3;
  lys_module *plVar4;
  lyd_node *plVar5;
  lyd_node *node;
  lyd_node *local_50;
  lyd_node *local_48;
  lyd_node *next;
  lyd_node *local_38;
  
  if ((parent == (lyd_node *)0x0 && first_dst_p == (lyd_node **)0x0) ||
     (first_src->prev->next != (lyd_node *)0x0)) {
    __assert_fail("(parent || first_dst_p) && first_src && !first_src->prev->next",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                  ,0x3c4,
                  "LY_ERR lyd_move_nodes(struct lyd_node *, struct lyd_node **, struct lyd_node *)")
    ;
  }
  local_48 = first_src;
  if (((first_dst_p == (lyd_node **)0x0) || (local_50 = *first_dst_p, local_50 == (lyd_node *)0x0))
     && (local_50 = lyd_child(parent), local_50 == (lyd_node *)0x0)) {
    if (first_src->parent != (lyd_node_inner *)0x0) {
      __assert_fail("!lyd_child(parent) && first_src && !first_src->prev->next && !first_src->parent"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                    ,0x378,"LY_ERR lyd_move_nodes_at_once(struct lyd_node *, struct lyd_node *)");
    }
    LVar3 = lyd_unlink_check(first_src);
    plVar1 = first_src;
    if (LVar3 == LY_SUCCESS) {
      plVar5 = first_src->next;
      next = first_src;
      lyd_unlink_ignore_lyds(&local_48,first_src);
      node = plVar5;
      if (parent == (lyd_node *)0x0) goto LAB_0011f89b;
      lyd_insert_only_child(parent,first_src);
      node = first_src;
      while( true ) {
        lyd_insert_hash(node);
        node = plVar5;
LAB_0011f89b:
        if (node == (lyd_node *)0x0) break;
        plVar5 = node->next;
        LVar3 = lyd_unlink_check(node);
        plVar1 = first_src;
        if (LVar3 != LY_SUCCESS) goto LAB_0011f875;
        lyd_unlink_ignore_lyds(&local_48,node);
        lyd_insert_after_node(&next,next->prev,node);
      }
      LVar3 = LY_SUCCESS;
      plVar1 = first_src;
    }
  }
  else {
    if ((local_50->prev->next != (lyd_node *)0x0) || (first_src->parent != (lyd_node_inner *)0x0)) {
      __assert_fail("first_dst && *first_dst && !(*first_dst)->prev->next && first_src && !first_src->prev->next && !first_src->parent"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                    ,0x3a0,"LY_ERR lyd_move_nodes_by_schema(struct lyd_node **, struct lyd_node *)")
      ;
    }
LAB_0011f716:
    do {
      LVar3 = LY_SUCCESS;
      plVar1 = local_50;
      if (first_src == (lyd_node *)0x0) break;
      lVar2 = lyds_is_supported(first_src);
      if ((lVar2 != '\0') &&
         (LVar3 = lyd_find_sibling_schema(local_50,first_src->schema,&local_38), LVar3 == LY_SUCCESS
         )) {
        LVar3 = lyds_merge(&local_50,&local_38,&local_48,first_src,&next);
        first_src = next;
        if (LVar3 == LY_SUCCESS) goto LAB_0011f716;
        if (local_48->schema == (lysc_node *)0x0) {
          plVar4 = (lys_module *)&local_48[2].schema;
        }
        else {
          plVar4 = local_48->schema->module;
        }
        ly_log(plVar4->ctx,LY_LLWRN,LY_SUCCESS,"Data in \"%s\" are not sorted.",
               local_38->schema->name);
        first_src = next;
      }
      LVar3 = lyd_move_nodes_ordby_schema(&local_50,first_src,&next);
      first_src = next;
      plVar1 = local_50;
    } while (LVar3 == LY_SUCCESS);
  }
LAB_0011f875:
  local_50 = plVar1;
  if (first_dst_p != (lyd_node **)0x0) {
    *first_dst_p = local_50;
  }
  return LVar3;
}

Assistant:

static LY_ERR
lyd_move_nodes(struct lyd_node *parent, struct lyd_node **first_dst_p, struct lyd_node *first_src)
{
    LY_ERR ret;
    struct lyd_node *first_dst;

    assert((parent || first_dst_p) && first_src && !first_src->prev->next);

    if (!first_dst_p || !*first_dst_p) {
        first_dst = lyd_child(parent);
    } else {
        first_dst = *first_dst_p;
    }

    if (first_dst) {
        ret = lyd_move_nodes_by_schema(&first_dst, first_src);
    } else {
        ret = lyd_move_nodes_at_once(parent, first_src);
        first_dst = first_src;
    }

    if (first_dst_p) {
        *first_dst_p = first_dst;
    }

    return ret;
}